

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<$3d6ce247$>::~SmallVectorImpl(SmallVectorImpl<_3d6ce247_> *this)

{
  bool bVar1;
  SmallVectorImpl<_3d6ce247_> *this_local;
  
  SmallVectorTemplateBase<$1fc6c516$>::destroy_range
            ((InstanceGroupRef<_b8373603_> *)
             (this->super_SmallVectorTemplateBase<_1fc6c516_>).
             super_SmallVectorTemplateCommon<_7cecdb41_>.super_SmallVectorBase.BeginX,
             (InstanceGroupRef<_b8373603_> *)
             (this->super_SmallVectorTemplateBase<_1fc6c516_>).
             super_SmallVectorTemplateCommon<_7cecdb41_>.super_SmallVectorBase.EndX);
  bVar1 = SmallVectorTemplateCommon<$7cecdb41$>::isSmall
                    ((SmallVectorTemplateCommon<_7cecdb41_> *)this);
  if (!bVar1) {
    free((this->super_SmallVectorTemplateBase<_1fc6c516_>).
         super_SmallVectorTemplateCommon<_7cecdb41_>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }